

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O0

void __thiscall
cfd::core::Serializer::AddVariableBuffer(Serializer *this,uint8_t *buffer,uint32_t buffer_size)

{
  uint32_t buffer_size_local;
  uint8_t *buffer_local;
  Serializer *this_local;
  
  AddVariableInt(this,(ulong)buffer_size);
  AddDirectBytes(this,buffer,buffer_size);
  return;
}

Assistant:

void Serializer::AddVariableBuffer(
    const uint8_t* buffer, uint32_t buffer_size) {
  AddVariableInt(buffer_size);
  AddDirectBytes(buffer, buffer_size);
}